

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::anon_unknown_0::BasicAllTargetsAtomic::AtomicCube<unsigned_int>
          (BasicAllTargetsAtomic *this,GLenum internalformat)

{
  byte bVar1;
  GLenum GVar2;
  bool bVar3;
  GLuint GVar4;
  GLenum GVar5;
  GLenum GVar6;
  GLint GVar7;
  char *src_fs;
  reference pvVar8;
  CallLogWrapper *pCVar9;
  Vector<float,_4> local_8c;
  byte local_7a;
  allocator<unsigned_int> local_79;
  undefined1 local_78 [6];
  bool status;
  vector<unsigned_int,_std::allocator<unsigned_int>_> data;
  int kSize;
  GLuint textures [2];
  string local_48;
  GLuint local_24;
  char *pcStack_20;
  GLuint program;
  char *src_vs;
  BasicAllTargetsAtomic *pBStack_10;
  GLenum internalformat_local;
  BasicAllTargetsAtomic *this_local;
  
  pcStack_20 = 
  "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
  ;
  src_vs._4_4_ = internalformat;
  pBStack_10 = this;
  GenFSCube<unsigned_int>(&local_48,this,internalformat);
  src_fs = (char *)std::__cxx11::string::c_str();
  GVar4 = ShaderImageLoadStoreBase::BuildProgram
                    (&this->super_ShaderImageLoadStoreBase,
                     "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                     ,(char *)0x0,(char *)0x0,(char *)0x0,src_fs,(bool *)0x0);
  std::__cxx11::string::~string((string *)&local_48);
  local_24 = GVar4;
  glu::CallLogWrapper::glGenTextures
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,2,
             (GLuint *)
             ((long)&data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4));
  data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0x10;
  std::allocator<unsigned_int>::allocator(&local_79);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78,0xc00,&local_79);
  std::allocator<unsigned_int>::~allocator(&local_79);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8513,
             data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8513,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8513,0x2800,0x2600);
  GVar2 = src_vs._4_4_;
  GVar5 = ShaderImageLoadStoreBase::Format<unsigned_int>(&this->super_ShaderImageLoadStoreBase);
  GVar6 = ShaderImageLoadStoreBase::Type<unsigned_int>(&this->super_ShaderImageLoadStoreBase);
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78,0);
  glu::CallLogWrapper::glTexImage2D
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8516,0,GVar2,0x10,0x10,0,GVar5,GVar6,pvVar8);
  GVar2 = src_vs._4_4_;
  GVar5 = ShaderImageLoadStoreBase::Format<unsigned_int>(&this->super_ShaderImageLoadStoreBase);
  GVar6 = ShaderImageLoadStoreBase::Type<unsigned_int>(&this->super_ShaderImageLoadStoreBase);
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78,0);
  glu::CallLogWrapper::glTexImage2D
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8515,0,GVar2,0x10,0x10,0,GVar5,GVar6,pvVar8);
  GVar2 = src_vs._4_4_;
  GVar5 = ShaderImageLoadStoreBase::Format<unsigned_int>(&this->super_ShaderImageLoadStoreBase);
  GVar6 = ShaderImageLoadStoreBase::Type<unsigned_int>(&this->super_ShaderImageLoadStoreBase);
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78,0);
  glu::CallLogWrapper::glTexImage2D
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8518,0,GVar2,0x10,0x10,0,GVar5,GVar6,pvVar8);
  GVar2 = src_vs._4_4_;
  GVar5 = ShaderImageLoadStoreBase::Format<unsigned_int>(&this->super_ShaderImageLoadStoreBase);
  GVar6 = ShaderImageLoadStoreBase::Type<unsigned_int>(&this->super_ShaderImageLoadStoreBase);
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78,0);
  glu::CallLogWrapper::glTexImage2D
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8517,0,GVar2,0x10,0x10,0,GVar5,GVar6,pvVar8);
  GVar2 = src_vs._4_4_;
  GVar5 = ShaderImageLoadStoreBase::Format<unsigned_int>(&this->super_ShaderImageLoadStoreBase);
  GVar6 = ShaderImageLoadStoreBase::Type<unsigned_int>(&this->super_ShaderImageLoadStoreBase);
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78,0);
  glu::CallLogWrapper::glTexImage2D
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x851a,0,GVar2,0x10,0x10,0,GVar5,GVar6,pvVar8);
  GVar2 = src_vs._4_4_;
  GVar5 = ShaderImageLoadStoreBase::Format<unsigned_int>(&this->super_ShaderImageLoadStoreBase);
  GVar6 = ShaderImageLoadStoreBase::Type<unsigned_int>(&this->super_ShaderImageLoadStoreBase);
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78,0);
  glu::CallLogWrapper::glTexImage2D
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8519,0,GVar2,0x10,0x10,0,GVar5,GVar6,pvVar8);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8513,0);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x9009,kSize);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x9009,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x9009,0x2800,0x2600);
  GVar2 = src_vs._4_4_;
  GVar5 = ShaderImageLoadStoreBase::Format<unsigned_int>(&this->super_ShaderImageLoadStoreBase);
  GVar6 = ShaderImageLoadStoreBase::Type<unsigned_int>(&this->super_ShaderImageLoadStoreBase);
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78,0);
  glu::CallLogWrapper::glTexImage3D
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x9009,0,GVar2,0x10,0x10,0xc,0,GVar5,GVar6,pvVar8);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x9009,0);
  glu::CallLogWrapper::glBindImageTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0,
             data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_,0,'\x01',0,0x88ba,src_vs._4_4_);
  glu::CallLogWrapper::glBindImageTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,kSize,0,'\x01',0,0x88ba,src_vs._4_4_);
  glu::CallLogWrapper::glClear
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x4000);
  glu::CallLogWrapper::glUseProgram
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,local_24);
  pCVar9 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
            super_CallLogWrapper;
  GVar7 = glu::CallLogWrapper::glGetUniformLocation(pCVar9,local_24,"g_image_cube");
  glu::CallLogWrapper::glUniform1i(pCVar9,GVar7,0);
  pCVar9 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
            super_CallLogWrapper;
  GVar7 = glu::CallLogWrapper::glGetUniformLocation(pCVar9,local_24,"g_image_cube_array");
  glu::CallLogWrapper::glUniform1i(pCVar9,GVar7,1);
  glu::CallLogWrapper::glBindVertexArray
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_vao);
  glu::CallLogWrapper::glViewport
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0,0,0x10,0x10);
  glu::CallLogWrapper::glDrawArrays
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,5,0,4);
  local_7a = 1;
  tcu::Vector<float,_4>::Vector(&local_8c,0.0,1.0,0.0,1.0);
  bVar3 = ShaderImageLoadStoreBase::ValidateReadBuffer
                    (&this->super_ShaderImageLoadStoreBase,0,0,0x10,0x10,&local_8c);
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    local_7a = 0;
  }
  glu::CallLogWrapper::glUseProgram
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,local_24);
  glu::CallLogWrapper::glDeleteTextures
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,2,
             (GLuint *)
             ((long)&data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4));
  bVar1 = local_7a;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78);
  return (bool)(bVar1 & 1);
}

Assistant:

bool AtomicCube(GLenum internalformat)
	{
		const char* src_vs = "#version 420 core" NL "layout(location = 0) in vec4 i_position;" NL "void main() {" NL
							 "  gl_Position = i_position;" NL "}";
		const GLuint program = BuildProgram(src_vs, NULL, NULL, NULL, GenFSCube<T>(internalformat).c_str());
		GLuint		 textures[2];
		glGenTextures(2, textures);

		const int	  kSize = 16;
		std::vector<T> data(kSize * kSize * 12);

		glBindTexture(GL_TEXTURE_CUBE_MAP, textures[0]);
		glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_X, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(),
					 &data[0]);
		glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(),
					 &data[0]);
		glTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(),
					 &data[0]);
		glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Y, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(),
					 &data[0]);
		glTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Z, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(),
					 &data[0]);
		glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Z, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(),
					 &data[0]);
		glBindTexture(GL_TEXTURE_CUBE_MAP, 0);

		glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, textures[1]);
		glTexParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, internalformat, kSize, kSize, 12, 0, Format<T>(), Type<T>(),
					 &data[0]);
		glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, 0);

		glBindImageTexture(0, textures[0], 0, GL_TRUE, 0, GL_READ_WRITE, internalformat);
		glBindImageTexture(1, textures[1], 0, GL_TRUE, 0, GL_READ_WRITE, internalformat);

		glClear(GL_COLOR_BUFFER_BIT);

		glUseProgram(program);
		glUniform1i(glGetUniformLocation(program, "g_image_cube"), 0);
		glUniform1i(glGetUniformLocation(program, "g_image_cube_array"), 1);

		glBindVertexArray(m_vao);
		glViewport(0, 0, kSize, kSize);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		bool status = true;

		if (!ValidateReadBuffer(0, 0, kSize, kSize, vec4(0, 1, 0, 1)))
		{
			status = false;
		}

		glUseProgram(0);
		glDeleteProgram(program);
		glDeleteTextures(2, textures);

		return status;
	}